

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomFiveAction.cpp
# Opt level: O1

ActionResults * __thiscall BlueRoomFiveAction::Use(BlueRoomFiveAction *this)

{
  itemType iVar1;
  ActionResults *pAVar2;
  _Alloc_hider _Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  string local_58;
  string local_38;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == TORCH) {
    pAVar2 = (ActionResults *)operator_new(0x30);
    paVar4 = &local_38.field_2;
    local_38._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"You\'ve already used the torch.","");
    ActionResults::ActionResults(pAVar2,CURRENT,&local_38);
    _Var3._M_p = local_38._M_dataplus._M_p;
  }
  else {
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (iVar1 != STATUE) {
      pAVar2 = AbstractRoomAction::Use(&this->super_AbstractRoomAction);
      return pAVar2;
    }
    pAVar2 = (ActionResults *)operator_new(0x30);
    paVar4 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,
               "The statue awaits your action. You attempt to trigger its innate action. Kind of a stand off I guess. Maybe try something else?"
               ,"");
    ActionResults::ActionResults(pAVar2,CURRENT,&local_58);
    _Var3._M_p = local_58._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar4) {
    operator_delete(_Var3._M_p);
  }
  return pAVar2;
}

Assistant:

ActionResults *BlueRoomFiveAction::Use() {
    if(commands->getMainItem() == TORCH) {
        return new ActionResults(CURRENT, "You've already used the torch.");
    }else if(commands->getMainItem() == STATUE){
        return new ActionResults(CURRENT, "The statue awaits your action. You attempt to trigger its innate action. Kind of a stand off I guess. Maybe try something else?");
    }else {
        return AbstractRoomAction::Use();
    }
}